

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::Clear
          (FeatureSetDefaults_FeatureSetEditionDefault *this)

{
  FeatureSet *pFVar1;
  char *pcVar2;
  anon_union_32_1_493b367e_for_FeatureSetDefaults_FeatureSetEditionDefault_3 aVar3;
  int line;
  LogMessageFatal local_20;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x3) != (undefined1  [32])0x0) {
    if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      pFVar1 = (this->field_0)._impl_.overridable_features_;
      if (pFVar1 == (FeatureSet *)0x0) {
        pcVar2 = "from._impl_.overridable_features_ != nullptr";
        line = 0x365c;
        goto LAB_001af13d;
      }
      FeatureSet::Clear(pFVar1);
    }
    if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      pFVar1 = (this->field_0)._impl_.fixed_features_;
      if (pFVar1 == (FeatureSet *)0x0) {
        pcVar2 = "from._impl_.fixed_features_ != nullptr";
        line = 0x3660;
LAB_001af13d:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,line,pcVar2 + 5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      FeatureSet::Clear(pFVar1);
    }
  }
  (this->field_0)._impl_.edition_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FeatureSetDefaults_FeatureSetEditionDefault::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.overridable_features_ != nullptr);
      _impl_.overridable_features_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.fixed_features_ != nullptr);
      _impl_.fixed_features_->Clear();
    }
  }
  _impl_.edition_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}